

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildUnionEnumSwitchCaseWritter
          (SwiftGenerator *this,EnumDef *ed)

{
  CodeWriter *this_00;
  int *piVar1;
  int iVar2;
  pointer ppEVar3;
  string local_218;
  string is_struct;
  string type;
  string local_1b8;
  string local_198;
  string variant;
  string local_158;
  EnumVal ev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"switch type {",(allocator<char> *)&ev);
  this_00 = &this->code_;
  CodeWriter::operator+=(this_00,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  for (ppEVar3 = (ed->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar3 < (ed->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppEVar3 = ppEVar3 + 1) {
    EnumVal::EnumVal(&ev,*ppEVar3);
    IdlNamer::LegacySwiftVariant_abi_cxx11_(&variant,&this->namer_,&ev);
    GenType_abi_cxx11_(&type,this,&ev.union_type,false);
    if ((ev.union_type.base_type == BASE_TYPE_STRUCT) && ((ev.union_type.struct_def)->fixed == true)
       ) {
      Mutable_abi_cxx11_(&local_218,this);
      std::operator+(&is_struct,&type,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
    }
    else {
      std::__cxx11::string::string((string *)&is_struct,(string *)&type);
    }
    if (ev.union_type.base_type != BASE_TYPE_NONE) {
      std::operator+(&local_218,"case .",&variant);
      std::operator+(&local_50,&local_218,":");
      CodeWriter::operator+=(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_218);
      piVar1 = &(this->code_).cur_ident_lvl_;
      *piVar1 = *piVar1 + 1;
      GenType_abi_cxx11_(&local_218,this,&ev.union_type,true);
      std::operator+(&local_70,"var __obj = value as? ",&local_218);
      CodeWriter::operator+=(this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator+(&local_218,"return ",&is_struct);
      std::operator+(&local_90,&local_218,".pack(&builder, obj: &__obj)");
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_218);
      iVar2 = (this->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (this->code_).cur_ident_lvl_ = iVar2 + -1;
      }
    }
    std::__cxx11::string::~string((string *)&is_struct);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&variant);
    EnumVal::~EnumVal(&ev);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"default: return Offset()",(allocator<char> *)&ev);
  CodeWriter::operator+=(this_00,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"}",(allocator<char> *)&ev);
  CodeWriter::operator+=(this_00,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void BuildUnionEnumSwitchCaseWritter(const EnumDef &ed) {
    code_ += "switch type {";
    for (auto it = ed.Vals().begin(); it < ed.Vals().end(); ++it) {
      const auto ev = **it;
      const auto variant = namer_.LegacySwiftVariant(ev);
      const auto type = GenType(ev.union_type);
      const auto is_struct = IsStruct(ev.union_type) ? type + Mutable() : type;
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      code_ += "case ." + variant + ":";
      Indent();
      code_ += "var __obj = value as? " + GenType(ev.union_type, true);
      code_ += "return " + is_struct + ".pack(&builder, obj: &__obj)";
      Outdent();
    }
    code_ += "default: return Offset()";
    code_ += "}";
  }